

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.h
# Opt level: O0

void __thiscall
ktx::PrintIndent::operator()(PrintIndent *this,int depth,char (*fmt) [5],char **args)

{
  format_string<const_char_*&> fmt_00;
  format_string<const_char_(&)[1],_int> fmt_01;
  int iVar1;
  ostream *os;
  int *in_RCX;
  char (*in_RDX) [1];
  int in_ESI;
  char *in_RDI;
  undefined4 in_stack_ffffffffffffff78;
  char *pcVar2;
  undefined4 in_stack_ffffffffffffffa0;
  char *pcVar3;
  char *pcVar4;
  
  pcVar4 = "{:{}}";
  pcVar2 = "{:{}}";
  pcVar3 = in_RDI;
  std::char_traits<char>::length((char_type *)0x1d6627);
  iVar1 = *(int *)(in_RDI + 0xc) * (*(int *)(in_RDI + 8) + in_ESI);
  fmt_01.str_.size_ = (size_t)pcVar4;
  fmt_01.str_.data_ = pcVar3;
  ::fmt::v10::print<char_const(&)[1],int>
            ((ostream *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),fmt_01,in_RDX,in_RCX);
  os = (ostream *)std::char_traits<char>::length((char_type *)0x1d66e2);
  fmt_00.str_.data_._4_4_ = iVar1;
  fmt_00.str_.data_._0_4_ = in_stack_ffffffffffffff78;
  fmt_00.str_.size_ = (size_t)pcVar2;
  ::fmt::v10::print<char_const*&>(os,fmt_00,(char **)in_RDX);
  return;
}

Assistant:

inline void operator()(int depth, Fmt&& fmt, Args&&... args) {
        fmt::print(os, "{:{}}", "", indentWidth * (indentBase + depth));
        fmt::print(os, std::forward<Fmt>(fmt), std::forward<Args>(args)...);
    }